

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O0

void __thiscall
cnn::RNNBuilder::start_new_sequence
          (RNNBuilder *this,
          vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *h_0)

{
  undefined8 in_RSI;
  RNNStateMachine *in_RDI;
  RNNOp in_stack_ffffffffffffffdc;
  int local_18;
  RNNPointer local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  RNNStateMachine::transition(in_RDI,in_stack_ffffffffffffffdc);
  local_18 = -1;
  RNNPointer::RNNPointer(&local_14,&local_18);
  RNNPointer::operator=((RNNPointer *)(in_RDI + 2),&local_14);
  std::vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>::clear
            ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)0x33f30e);
  (**(code **)(*(long *)in_RDI + 0x50))(in_RDI,local_10);
  return;
}

Assistant:

void start_new_sequence(const std::vector<Expression>& h_0={}) {
    sm.transition(RNNOp::start_new_sequence);
    cur = RNNPointer(-1);
    head.clear();
    start_new_sequence_impl(h_0);
  }